

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  SASL_MECHANISM_INTERFACE_DESCRIPTION *sasl_mechanism_interface_description;
  SASL_MECHANISM_HANDLE pSVar2;
  IO_INTERFACE_DESCRIPTION *pIVar3;
  XIO_HANDLE xio;
  CONNECTION_HANDLE connection;
  SESSION_HANDLE session;
  AMQP_VALUE source;
  AMQP_VALUE target;
  LINK_HANDLE link;
  MESSAGE_RECEIVER_HANDLE message_receiver;
  SASLCLIENTIO_CONFIG sasl_io_config;
  SASL_PLAIN_CONFIG sasl_plain_config;
  XIO_HANDLE local_78;
  SASL_MECHANISM_HANDLE local_70;
  char *local_68;
  char *local_60;
  undefined8 local_58;
  char *local_50;
  undefined4 local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  iVar1 = platform_init();
  if (iVar1 == 0) {
    local_68 = "<<<Replace with your own key name>>>";
    local_58 = 0;
    local_60 = "<<<Replace with your own key>>>";
    sasl_mechanism_interface_description = saslplain_get_interface();
    pSVar2 = saslmechanism_create(sasl_mechanism_interface_description,&local_68);
    local_50 = "<<<Replace with your own EH host (like myeventhub.servicebus.windows.net)>>>";
    local_48 = 0x1627;
    local_40 = 0;
    uStack_38 = 0;
    pIVar3 = platform_get_default_tlsio();
    local_78 = xio_create(pIVar3,&local_50);
    local_70 = pSVar2;
    pIVar3 = saslclientio_get_interface_description();
    xio = xio_create(pIVar3,&local_78);
    connection = connection_create(xio,
                                   "<<<Replace with your own EH host (like myeventhub.servicebus.windows.net)>>>"
                                   ,"whatever",(ON_NEW_ENDPOINT)0x0,(void *)0x0);
    session = session_create(connection,(ON_LINK_ATTACHED)0x0,(void *)0x0);
    session_set_incoming_window(session,100);
    source = messaging_create_source
                       (
                       "amqps://<<<Replace with your own EH host (like myeventhub.servicebus.windows.net)>>>/<<<Insert your event hub name here>>>/ConsumerGroups/$Default/Partitions/0"
                       );
    target = messaging_create_target("ingress-rx");
    link = link_create(session,"receiver-link",true,source,target);
    link_set_rcv_settle_mode(link,'\0');
    amqpvalue_destroy(source);
    amqpvalue_destroy(target);
    message_receiver =
         messagereceiver_create(link,(ON_MESSAGE_RECEIVER_STATE_CHANGED)0x0,(void *)0x0);
    if (message_receiver != (MESSAGE_RECEIVER_HANDLE)0x0) {
      iVar1 = messagereceiver_open(message_receiver,on_message_received,message_receiver);
      if (iVar1 == 0) {
        connection_dowork(connection);
        printf("Current memory usage:%lu (max:%lu)\r\n",0xffffffffffffffff,0xffffffffffffffff);
        do {
          connection_dowork(connection);
        } while( true );
      }
    }
    printf("Cannot open the message receiver.");
    messagereceiver_destroy(message_receiver);
    link_destroy(link);
    session_destroy(session);
    connection_destroy(connection);
    platform_deinit();
    printf("Max memory usage:%lu\r\n",0xffffffffffffffff);
    printf("Current memory usage:%lu\r\n",0xffffffffffffffff);
  }
  return -1;
}

Assistant:

int main(int argc, char** argv)
{
    int result;

    XIO_HANDLE sasl_io = NULL;
    CONNECTION_HANDLE connection = NULL;
    SESSION_HANDLE session = NULL;
    LINK_HANDLE link = NULL;
    MESSAGE_RECEIVER_HANDLE message_receiver = NULL;

    (void)argc;
    (void)argv;

    if (platform_init() != 0)
    {
        result = -1;
    }
    else
    {
        size_t last_memory_used = 0;
        AMQP_VALUE source;
        AMQP_VALUE target;
        SASL_PLAIN_CONFIG sasl_plain_config;
        SASL_MECHANISM_HANDLE sasl_mechanism_handle;
        TLSIO_CONFIG tls_io_config;
        const IO_INTERFACE_DESCRIPTION* tlsio_interface;
        XIO_HANDLE tls_io;
        SASLCLIENTIO_CONFIG sasl_io_config;

        gballoc_init();

        /* create SASL plain handler */
        sasl_plain_config.authcid = EH_KEY_NAME;
        sasl_plain_config.authzid = NULL;
        sasl_plain_config.passwd = EH_KEY;

        sasl_mechanism_handle = saslmechanism_create(saslplain_get_interface(), &sasl_plain_config);

        /* create the TLS IO */
        tls_io_config.hostname = EH_HOST;
        tls_io_config.port = 5671;
        tls_io_config.underlying_io_interface = NULL;
        tls_io_config.underlying_io_parameters = NULL;

        tlsio_interface = platform_get_default_tlsio();
        tls_io = xio_create(tlsio_interface, &tls_io_config);

        /* create the SASL client IO using the TLS IO */
        sasl_io_config.underlying_io = tls_io;
        sasl_io_config.sasl_mechanism = sasl_mechanism_handle;
        sasl_io = xio_create(saslclientio_get_interface_description(), &sasl_io_config);

        /* create the connection, session and link */
        connection = connection_create(sasl_io, EH_HOST, "whatever", NULL, NULL);
        session = session_create(connection, NULL, NULL);

        /* set incoming window to 100 for the session */
        session_set_incoming_window(session, 100);

        /* listen only on partition 0 */
        source = messaging_create_source("amqps://" EH_HOST "/" EH_NAME "/ConsumerGroups/$Default/Partitions/0");
        target = messaging_create_target("ingress-rx");
        link = link_create(session, "receiver-link", role_receiver, source, target);
        link_set_rcv_settle_mode(link, receiver_settle_mode_first);
        amqpvalue_destroy(source);
        amqpvalue_destroy(target);

        /* create a message receiver */
        message_receiver = messagereceiver_create(link, NULL, NULL);
        if ((message_receiver == NULL) ||
            (messagereceiver_open(message_receiver, on_message_received, message_receiver) != 0))
        {
            (void)printf("Cannot open the message receiver.");
            result = -1;
        }
        else
        {
            bool keep_running = true;
            while (keep_running)
            {
                size_t current_memory_used;
                size_t maximum_memory_used;
                connection_dowork(connection);

                current_memory_used = gballoc_getCurrentMemoryUsed();
                maximum_memory_used = gballoc_getMaximumMemoryUsed();

                if (current_memory_used != last_memory_used)
                {
                    (void)printf("Current memory usage:%lu (max:%lu)\r\n", (unsigned long)current_memory_used, (unsigned long)maximum_memory_used);
                    last_memory_used = current_memory_used;
                }
            }

            result = 0;
        }

        messagereceiver_destroy(message_receiver);
        link_destroy(link);
        session_destroy(session);
        connection_destroy(connection);
        platform_deinit();

        (void)printf("Max memory usage:%lu\r\n", (unsigned long)gballoc_getCurrentMemoryUsed());
        (void)printf("Current memory usage:%lu\r\n", (unsigned long)gballoc_getMaximumMemoryUsed());

        gballoc_deinit();
    }

    return result;
}